

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ELU_x86_avx::forward_inplace(ELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  _func_int *p_Var5;
  ulong uVar6;
  long lVar7;
  undefined1 (*pauVar8) [32];
  long lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  
  iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
  pp_Var1 = this->_vptr_ELU_x86_avx;
  uVar12 = 0;
  uVar6 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar6 = uVar12;
  }
  auVar35 = ZEXT3264(CONCAT428(0x3f800000,
                               CONCAT424(0x3f800000,
                                         CONCAT420(0x3f800000,
                                                   CONCAT416(0x3f800000,
                                                             CONCAT412(0x3f800000,
                                                                       CONCAT48(0x3f800000,
                                                                                0x3f8000003f800000))
                                                            )))));
  for (; uVar12 != uVar6; uVar12 = uVar12 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar8 = (undefined1 (*) [32])(sVar4 * uVar12 * sVar3 + (long)pvVar2);
    fVar13 = *(float *)(&this->field_0xd0 + (long)pp_Var1[-3]);
    lVar9 = 0;
    for (iVar11 = 0; iVar11 + 7 < iVar10; iVar11 = iVar11 + 8) {
      auVar29 = vminps_avx(*pauVar8,ZEXT1632(ZEXT816(0) << 0x40));
      auVar27._8_4_ = 0x42b0c0a5;
      auVar27._0_8_ = 0x42b0c0a542b0c0a5;
      auVar27._12_4_ = 0x42b0c0a5;
      auVar27._16_4_ = 0x42b0c0a5;
      auVar27._20_4_ = 0x42b0c0a5;
      auVar27._24_4_ = 0x42b0c0a5;
      auVar27._28_4_ = 0x42b0c0a5;
      auVar29 = vminps_avx(auVar29,auVar27);
      auVar28._8_4_ = 0xc2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._12_4_ = 0xc2b0c0a5;
      auVar28._16_4_ = 0xc2b0c0a5;
      auVar28._20_4_ = 0xc2b0c0a5;
      auVar28._24_4_ = 0xc2b0c0a5;
      auVar28._28_4_ = 0xc2b0c0a5;
      auVar27 = vmaxps_avx(auVar29,auVar28);
      auVar29._0_4_ = auVar27._0_4_ * 1.442695 + 0.5;
      auVar29._4_4_ = auVar27._4_4_ * 1.442695 + 0.5;
      auVar29._8_4_ = auVar27._8_4_ * 1.442695 + 0.5;
      auVar29._12_4_ = auVar27._12_4_ * 1.442695 + 0.5;
      auVar29._16_4_ = auVar27._16_4_ * 1.442695 + 0.5;
      auVar29._20_4_ = auVar27._20_4_ * 1.442695 + 0.5;
      auVar29._24_4_ = auVar27._24_4_ * 1.442695 + 0.5;
      auVar29._28_4_ = 0x3ff8aa3b;
      auVar28 = vroundps_avx(auVar29,1);
      auVar29 = vcmpps_avx(auVar29,auVar28,1);
      auVar29 = vandps_avx(auVar35._0_32_,auVar29);
      auVar29 = vsubps_avx(auVar28,auVar29);
      fVar16 = auVar27._0_4_ + auVar29._0_4_ * -0.6931472;
      fVar17 = auVar27._4_4_ + auVar29._4_4_ * -0.6931472;
      fVar18 = auVar27._8_4_ + auVar29._8_4_ * -0.6931472;
      fVar19 = auVar27._12_4_ + auVar29._12_4_ * -0.6931472;
      fVar20 = auVar27._16_4_ + auVar29._16_4_ * -0.6931472;
      fVar21 = auVar27._20_4_ + auVar29._20_4_ * -0.6931472;
      fVar22 = auVar27._24_4_ + auVar29._24_4_ * -0.6931472;
      auVar23._0_4_ = (int)auVar29._0_4_;
      auVar23._4_4_ = (int)auVar29._4_4_;
      auVar23._8_4_ = (int)auVar29._8_4_;
      auVar23._12_4_ = (int)auVar29._12_4_;
      auVar30._16_4_ = (int)auVar29._16_4_;
      auVar30._0_16_ = auVar23;
      auVar30._20_4_ = (int)auVar29._20_4_;
      auVar30._24_4_ = (int)auVar29._24_4_;
      auVar30._28_4_ = (int)auVar29._28_4_;
      auVar31 = vpslld_avx(auVar23,0x17);
      auVar23 = vpslld_avx(auVar30._16_16_,0x17);
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar23 = vpaddd_avx(auVar23,auVar33);
      auVar31 = vpaddd_avx(auVar31,auVar33);
      auVar29 = vmaxps_avx(*pauVar8,ZEXT1632(ZEXT816(0) << 0x40));
      auVar15._0_4_ =
           ((auVar35._0_4_ + fVar16 +
            fVar16 * fVar16 *
            (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
              0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar31._0_4_ + -1.0) * fVar13
           + auVar29._0_4_;
      auVar15._4_4_ =
           ((auVar35._4_4_ + fVar17 +
            fVar17 * fVar17 *
            (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
              0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar31._4_4_ + -1.0) * fVar13
           + auVar29._4_4_;
      auVar15._8_4_ =
           ((auVar35._8_4_ + fVar18 +
            fVar18 * fVar18 *
            (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
              0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar31._8_4_ + -1.0) * fVar13
           + auVar29._8_4_;
      auVar15._12_4_ =
           ((auVar35._12_4_ + fVar19 +
            fVar19 * fVar19 *
            (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
              0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar31._12_4_ + -1.0) * fVar13
           + auVar29._12_4_;
      auVar15._16_4_ =
           ((auVar35._16_4_ + fVar20 +
            fVar20 * fVar20 *
            (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
              0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar23._0_4_ + -1.0) * fVar13
           + auVar29._16_4_;
      auVar15._20_4_ =
           ((auVar35._20_4_ + fVar21 +
            fVar21 * fVar21 *
            (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
              0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar23._4_4_ + -1.0) * fVar13
           + auVar29._20_4_;
      auVar15._24_4_ =
           ((auVar35._24_4_ + fVar22 +
            fVar22 * fVar22 *
            (((((fVar22 * 0.00019875691 + 0.0013981999) * fVar22 + 0.008333452) * fVar22 +
              0.041665796) * fVar22 + 0.16666666) * fVar22 + 0.5)) * auVar23._8_4_ + -1.0) * fVar13
           + auVar29._24_4_;
      auVar15._28_4_ =
           auVar35._28_4_ + auVar27._28_4_ + auVar28._28_4_ + auVar28._28_4_ + -1.0 + auVar29._28_4_
      ;
      *pauVar8 = auVar15;
      pauVar8 = pauVar8 + 1;
      lVar9 = lVar9 + 8;
    }
    fVar13 = *(float *)(&this->field_0xd0 + (long)pp_Var1[-3]);
    for (; iVar11 + 3 < iVar10; iVar11 = iVar11 + 4) {
      auVar23 = vminps_avx(*(undefined1 (*) [16])*pauVar8,ZEXT816(0) << 0x40);
      auVar31._8_4_ = 0x42b0c0a5;
      auVar31._0_8_ = 0x42b0c0a542b0c0a5;
      auVar31._12_4_ = 0x42b0c0a5;
      auVar23 = vminps_avx(auVar23,auVar31);
      auVar24._8_4_ = 0xc2b0c0a5;
      auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar24._12_4_ = 0xc2b0c0a5;
      auVar33 = vmaxps_avx(auVar23,auVar24);
      auVar25._0_4_ = auVar33._0_4_ * 1.442695 + 0.5;
      auVar25._4_4_ = auVar33._4_4_ * 1.442695 + 0.5;
      auVar25._8_4_ = auVar33._8_4_ * 1.442695 + 0.5;
      auVar25._12_4_ = auVar33._12_4_ * 1.442695 + 0.5;
      auVar32._0_4_ = (int)auVar25._0_4_;
      auVar32._4_4_ = (int)auVar25._4_4_;
      auVar32._8_4_ = (int)auVar25._8_4_;
      auVar32._12_4_ = (int)auVar25._12_4_;
      auVar31 = vcvtdq2ps_avx(auVar32);
      auVar23 = vcmpps_avx(auVar25,auVar31,1);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = 0x3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar23 = vandps_avx(auVar23,auVar34);
      auVar23 = vsubps_avx(auVar31,auVar23);
      fVar16 = auVar33._0_4_ + auVar23._0_4_ * -0.6931472;
      fVar17 = auVar33._4_4_ + auVar23._4_4_ * -0.6931472;
      fVar18 = auVar33._8_4_ + auVar23._8_4_ * -0.6931472;
      fVar19 = auVar33._12_4_ + auVar23._12_4_ * -0.6931472;
      auVar26._0_4_ = (int)auVar23._0_4_;
      auVar26._4_4_ = (int)auVar23._4_4_;
      auVar26._8_4_ = (int)auVar23._8_4_;
      auVar26._12_4_ = (int)auVar23._12_4_;
      auVar23 = vpslld_avx(auVar26,0x17);
      auVar31 = vpaddd_avx(auVar23,auVar34);
      auVar23 = vmaxps_avx(*(undefined1 (*) [16])*pauVar8,ZEXT816(0) << 0x40);
      auVar14._0_4_ =
           ((fVar16 + 1.0 +
            fVar16 * fVar16 *
            (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
              0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar31._0_4_ + -1.0) * fVar13
           + auVar23._0_4_;
      auVar14._4_4_ =
           ((fVar17 + 1.0 +
            fVar17 * fVar17 *
            (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
              0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar31._4_4_ + -1.0) * fVar13
           + auVar23._4_4_;
      auVar14._8_4_ =
           ((fVar18 + 1.0 +
            fVar18 * fVar18 *
            (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
              0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar31._8_4_ + -1.0) * fVar13
           + auVar23._8_4_;
      auVar14._12_4_ =
           ((fVar19 + 1.0 +
            fVar19 * fVar19 *
            (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
              0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar31._12_4_ + -1.0) * fVar13
           + auVar23._12_4_;
      *(undefined1 (*) [16])*pauVar8 = auVar14;
      pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
      lVar9 = lVar9 + 4;
    }
    lVar7 = sVar4 * sVar3 * uVar12;
    for (; (int)lVar9 < iVar10; lVar9 = lVar9 + 1) {
      fVar13 = *(float *)((long)pvVar2 + lVar9 * 4 + lVar7);
      if (fVar13 < 0.0) {
        p_Var5 = pp_Var1[-3];
        fVar13 = expf(fVar13);
        auVar35 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        *(float *)((long)pvVar2 + lVar9 * 4 + lVar7) =
             (fVar13 + -1.0) * *(float *)(&this->field_0xd0 + (long)p_Var5);
      }
    }
  }
  return 0;
}

Assistant:

int ELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = static_cast<float>(alpha * (exp(*ptr) - 1.f));
            ptr++;
        }
    }

    return 0;
}